

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::StencilCase::visualizeStencil
          (StencilCase *this,Context *context,int stencilBits,int stencilStep)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec4 color;
  undefined4 local_60;
  float local_5c;
  float local_58;
  undefined4 local_54;
  Vec3 local_50;
  Vec3 local_40;
  
  iVar2 = 1 << ((byte)stencilBits & 0x1f);
  (*context->_vptr_Context[0x33])(context,0xb90,(long)iVar2 % (long)stencilStep & 0xffffffff);
  (*context->_vptr_Context[0x36])(context,0x1e00,0x1e00,0x1e00);
  if ((uint)(iVar2 / stencilStep) < 0x7fffffff) {
    uVar5 = iVar2 - 1;
    uVar4 = 1;
    if (1 < (int)uVar5) {
      uVar4 = uVar5;
    }
    iVar2 = iVar2 / stencilStep + 1;
    uVar6 = 0;
    do {
      uVar1 = uVar5;
      if ((int)uVar6 < (int)uVar5) {
        uVar1 = uVar6;
      }
      local_58 = (float)(int)uVar1 / (float)(int)uVar4;
      local_5c = 1.0 - local_58;
      local_60 = 0;
      local_54 = 0x3f800000;
      uVar3 = this->m_shaderID;
      (*context->_vptr_Context[0x76])(context,(ulong)uVar3);
      uVar3 = (*context->_vptr_Context[0x66])(context,(ulong)uVar3,"u_color");
      (*context->_vptr_Context[0x5f])(context,(ulong)uVar3,1,&local_60);
      (*context->_vptr_Context[0x35])(context,0x202,(ulong)uVar1,0xffffffff);
      local_40.m_data[0] = -1.0;
      local_40.m_data[1] = -1.0;
      local_40.m_data[2] = 0.0;
      local_50.m_data[0] = 1.0;
      local_50.m_data[1] = 1.0;
      local_50.m_data[2] = 0.0;
      sglr::drawQuad(context,this->m_shaderID,&local_40,&local_50);
      uVar6 = uVar6 + stencilStep;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void StencilCase::visualizeStencil (sglr::Context& context, int stencilBits, int stencilStep)
{
	int endVal				= 1<<stencilBits;
	int numStencilValues	= endVal/stencilStep + 1;

	context.enable(GL_STENCIL_TEST);
	context.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);

	for (int ndx = 0; ndx < numStencilValues; ndx++)
	{
		int			value		= deMin32(ndx*stencilStep, endVal-1);
		float		colorMix	= (float)value/(float)de::max(1, endVal-1);
		tcu::Vec4	color		(0.0f, 1.0f-colorMix, colorMix, 1.0f);

		m_shader.setColor(context, m_shaderID, color);
		context.stencilFunc(GL_EQUAL, value, 0xffffffffu);
		sglr::drawQuad(context, m_shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
	}
}